

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::validateKTXcubemapIncomplete
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint8_t value;
  int popCount;
  byte local_21;
  uint local_20;
  uint32_t local_1c;
  
  this->foundKTXcubemapIncomplete = true;
  local_1c = size;
  if ((size != 1) &&
     (error<unsigned_int&>(this,&Metadata::KTXcubemapIncompleteInvalidSize,&local_1c), local_1c == 0
     )) {
    return;
  }
  local_21 = *data;
  if (0x3f < local_21) {
    error<unsigned_char&>(this,&Metadata::KTXcubemapIncompleteInvalidBitSet,&local_21);
  }
  bVar2 = local_21 & 0x3f;
  if (bVar2 == 0) {
    local_20 = 0;
  }
  else {
    uVar4 = 0;
    bVar3 = local_21 & 0x3f;
    do {
      uVar4 = uVar4 + (bVar3 & 1);
      bVar1 = 1 < bVar3;
      bVar3 = bVar3 >> 1;
    } while (bVar1);
    local_20 = uVar4;
    if (uVar4 != 0) {
      local_21 = bVar2;
      if (uVar4 == 6) {
        warning<>(this,&Metadata::KTXcubemapIncompleteAllBitsSet);
        uVar4 = 6;
      }
      if ((this->header).layerCount % uVar4 != 0) {
        error<unsigned_int&,int_const&>
                  (this,&Metadata::KTXcubemapIncompleteIncompatibleLayerCount,
                   &(this->header).layerCount,(int *)&local_20);
      }
      goto LAB_001ae27a;
    }
  }
  local_21 = bVar2;
  error<>(this,&Metadata::KTXcubemapIncompleteNoBitSet);
LAB_001ae27a:
  if ((this->header).faceCount != 1) {
    error<unsigned_int&>
              (this,&Metadata::KTXcubemapIncompleteWithFaceCountNot1,&(this->header).faceCount);
  }
  if ((this->header).pixelHeight != (this->header).pixelWidth) {
    error<unsigned_int&,unsigned_int&>
              (this,&HeaderData::CubeHeightWidthMismatch,&(this->header).pixelWidth,
               &(this->header).pixelHeight);
  }
  if ((this->header).pixelDepth != 0) {
    error<unsigned_int&>(this,&HeaderData::CubeWithDepth,&(this->header).pixelDepth);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXcubemapIncomplete(const uint8_t* data, uint32_t size) {
    foundKTXcubemapIncomplete = true;

    if (size != 1)
        error(Metadata::KTXcubemapIncompleteInvalidSize, size);

    if (size == 0)
        return;

    uint8_t value = *data;

    if (size > 0 && (value & 0b11000000u) != 0)
        error(Metadata::KTXcubemapIncompleteInvalidBitSet, value);
    value = value & 0b00111111u; // Error recovery

    const auto popCount = popcount(value);
    if (popCount == 6)
        warning(Metadata::KTXcubemapIncompleteAllBitsSet);

    if (popCount == 0)
        error(Metadata::KTXcubemapIncompleteNoBitSet);

    if (popCount != 0 && (header.layerCount % popCount != 0))
        error(Metadata::KTXcubemapIncompleteIncompatibleLayerCount, header.layerCount, popCount);

    if (header.faceCount != 1)
        error(Metadata::KTXcubemapIncompleteWithFaceCountNot1, header.faceCount);

    if (header.pixelHeight != header.pixelWidth)
        error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0)
        error(HeaderData::CubeWithDepth, header.pixelDepth);
}